

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O2

ErrorKind * __thiscall
Fixpp::result::Result<void,_Fixpp::ErrorKind>::unwrapErr
          (ErrorKind *__return_storage_ptr__,Result<void,_Fixpp::ErrorKind> *this)

{
  if (this->ok_ == false) {
    ErrorKind::ErrorKind(__return_storage_ptr__,(ErrorKind *)&this->storage_);
    return __return_storage_ptr__;
  }
  fwrite("Attempting to unwrapErr an ok Result\n",0x25,1,_stderr);
  std::terminate();
}

Assistant:

E unwrapErr() const {
        if (isErr()) {
            return storage().template get<E>();
        }

        std::fprintf(stderr, "Attempting to unwrapErr an ok Result\n");
        std::terminate();
    }